

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_F26Dot6 Round_Down_To_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_Int color)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = (exc->tt_metrics).compensations[color];
  if (-1 < distance) {
    uVar2 = lVar1 + distance;
    uVar3 = 0;
    if (-1 < (long)uVar2) {
      uVar3 = uVar2 & 0xffffffffffffffc0;
    }
    return uVar3;
  }
  uVar3 = -(lVar1 - distance & 0xffffffffffffffc0U);
  return (long)uVar3 >> 0x3f & uVar3;
}

Assistant:

static FT_F26Dot6
  Round_Down_To_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_Int          color )
  {
    FT_F26Dot6  compensation = exc->tt_metrics.compensations[color];
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = FT_PIX_FLOOR( ADD_LONG( distance, compensation ) );
      if ( val < 0 )
        val = 0;
    }
    else
    {
      val = NEG_LONG( FT_PIX_FLOOR( SUB_LONG( compensation, distance ) ) );
      if ( val > 0 )
        val = 0;
    }

    return val;
  }